

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chkhostname.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *__s;
  char buff [1024];
  
  if (argc == 2) {
    iVar1 = Curl_gethostname(buff,0x400);
    if (iVar1 == 0) {
      iVar1 = strncmp(buff,argv[1],0x400);
      if (iVar1 == 0) {
        return 0;
      }
      __s = "got unexpected host name back, LD_PRELOAD failed";
    }
    else {
      __s = "Curl_gethostname() failed";
    }
    puts(__s);
  }
  else {
    printf("Usage: %s EXPECTED_HOSTNAME\n",*argv);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
  char buff[HOSTNAME_MAX];
  if(argc != 2) {
    printf("Usage: %s EXPECTED_HOSTNAME\n", argv[0]);
    return 1;
  }

  if(Curl_gethostname(buff, HOSTNAME_MAX)) {
    printf("Curl_gethostname() failed\n");
    return 1;
  }

  /* compare the name returned by Curl_gethostname() with the expected one */
  if(strncmp(buff, argv[1], HOSTNAME_MAX)) {
    printf("got unexpected host name back, LD_PRELOAD failed\n");
    return 1;
  }
  return 0;
}